

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

size_t __thiscall
backward::StackTraceImpl<backward::system_tag::linux_tag>::load_from
          (StackTraceImpl<backward::system_tag::linux_tag> *this,void *addr,size_t depth,
          void *context,void *error_addr)

{
  size_t *psVar1;
  pointer ppvVar2;
  pointer ppvVar3;
  ulong uVar4;
  size_t sVar5;
  ulong __new_size;
  
  load_here(this,depth + 8,context,error_addr);
  ppvVar2 = (this->super_StackTraceImplHolder)._stacktrace.
            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
            _M_start;
  ppvVar3 = (this->super_StackTraceImplHolder)._stacktrace.
            super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  uVar4 = (long)ppvVar3 - (long)ppvVar2 >> 3;
  if (ppvVar3 != ppvVar2) {
    sVar5 = 0;
    do {
      if (ppvVar2[sVar5] == addr) {
        (this->super_StackTraceImplHolder).super_StackTraceImplBase._skip = sVar5;
        break;
      }
      sVar5 = sVar5 + 1;
    } while (uVar4 + (uVar4 == 0) != sVar5);
  }
  __new_size = depth + (this->super_StackTraceImplHolder).super_StackTraceImplBase._skip;
  if (uVar4 <= __new_size) {
    __new_size = uVar4;
  }
  std::vector<void_*,_std::allocator<void_*>_>::resize
            (&(this->super_StackTraceImplHolder)._stacktrace,__new_size);
  uVar4 = (long)(this->super_StackTraceImplHolder)._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(this->super_StackTraceImplHolder)._stacktrace.
                super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3;
  psVar1 = &(this->super_StackTraceImplHolder).super_StackTraceImplBase._skip;
  sVar5 = 0;
  if (*psVar1 <= uVar4) {
    sVar5 = uVar4 - *psVar1;
  }
  return sVar5;
}

Assistant:

size_t load_from(void *addr, size_t depth = 32, void *context = nullptr,
                   void *error_addr = nullptr) {
    load_here(depth + 8, context, error_addr);

    for (size_t i = 0; i < _stacktrace.size(); ++i) {
      if (_stacktrace[i] == addr) {
        skip_n_firsts(i);
        break;
      }
    }

    _stacktrace.resize(std::min(_stacktrace.size(), skip_n_firsts() + depth));
    return size();
  }